

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

SyntaxTreeNode * __thiscall Parser::parseProgram(Parser *this,string *program)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  undefined1 local_1d8 [8];
  string line;
  stringstream splitter;
  SyntaxTreeNode *local_20;
  SyntaxTreeNode *programTree;
  string *program_local;
  Parser *this_local;
  
  local_20 = (SyntaxTreeNode *)operator_new(0x48);
  SyntaxTreeNode::SyntaxTreeNode(local_20,0x4ff7a);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(line.field_2._M_local_buf + 8),(string *)program,_Var2);
  while( true ) {
    bVar1 = std::ios::eof();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    std::__cxx11::string::string((string *)local_1d8);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)(line.field_2._M_local_buf + 8),(string *)local_1d8);
    local_20 = parseLine(this,(string *)local_1d8,local_20);
    std::__cxx11::string::~string((string *)local_1d8);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)(line.field_2._M_local_buf + 8));
  return local_20;
}

Assistant:

SyntaxTreeNode *Parser::parseProgram(const std::string &program) {
    auto *programTree = new SyntaxTreeNode(PROGRAM);
    std::stringstream splitter(program);
    while (!splitter.eof()) {
        std::string line;
        getline(splitter, line);
        programTree = parseLine(line, programTree);
    }
    return programTree;
}